

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O2

void __thiscall
kj::_::anon_unknown_0::MockExceptionCallback::onFatalException
          (MockExceptionCallback *this,Exception *exception)

{
  string *this_00;
  char *__last;
  undefined8 uVar1;
  Exception *params;
  String what;
  
  this_00 = &this->text;
  ::std::__cxx11::string::append((char *)this_00);
  str<kj::Exception&>(&what,(kj *)exception,params);
  if (what.content.size_ == 0) {
    what.content.ptr = "";
  }
  __last = strstr(what.content.ptr,"\nstack: ");
  if (__last == (char *)0x0) {
    ::std::__cxx11::string::append((char *)this_00);
  }
  else {
    ::std::__cxx11::string::append<char_const*,void>((string *)this_00,what.content.ptr,__last);
  }
  ::std::__cxx11::string::push_back((char)this_00);
  flush(this);
  uVar1 = __cxa_allocate_exception(1);
  __cxa_throw(uVar1,&(anonymous_namespace)::MockException::typeinfo,0);
}

Assistant:

void onFatalException(Exception&& exception) override {
    text += "fatal exception: ";
    auto what = str(exception);
    // Discard the stack trace.
    const char* end = strstr(what.cStr(), "\nstack: ");
    if (end == nullptr) {
      text += what.cStr();
    } else {
      text.append(what.cStr(), end);
    }
    text += '\n';
    flush();
#if KJ_NO_EXCEPTIONS
    if (outputPipe >= 0) {
      // This is a child process.  We got what we want, now exit quickly without writing any
      // additional messages, with a status code that the parent will interpret as "exited in the
      // way we expected".
      _exit(74);
    }
#else
    throw MockException();
#endif
  }